

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O3

void Vec_MemHashAlloc(Vec_Mem_t *p,int nTableSize)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  if ((p->vTable != (Vec_Int_t *)0x0) || (p->vNexts != (Vec_Int_t *)0x0)) {
    __assert_fail("p->vTable == NULL && p->vNexts == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                  ,0x13b,"void Vec_MemHashAlloc(Vec_Mem_t *, int)");
  }
  uVar6 = nTableSize - 1U;
  while( true ) {
    do {
      uVar5 = uVar6;
      uVar6 = uVar5 + 1;
    } while ((uVar5 & 1) != 0);
    if (uVar6 < 9) break;
    iVar4 = 5;
    while (uVar6 % (iVar4 - 2U) != 0) {
      uVar1 = iVar4 * iVar4;
      iVar4 = iVar4 + 2;
      if (uVar6 < uVar1) goto LAB_0052140e;
    }
  }
LAB_0052140e:
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  uVar1 = uVar6;
  if (uVar5 < 0xf) {
    uVar1 = 0x10;
  }
  pVVar2->nCap = uVar1;
  piVar3 = (int *)malloc((long)(int)uVar1 << 2);
  pVVar2->pArray = piVar3;
  pVVar2->nSize = uVar6;
  if (piVar3 != (int *)0x0) {
    memset(piVar3,0xff,(long)(int)uVar6 << 2);
  }
  p->vTable = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  if (nTableSize - 1U < 0xf) {
    nTableSize = 0x10;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = nTableSize;
  if (nTableSize == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)nTableSize << 2);
  }
  pVVar2->pArray = piVar3;
  p->vNexts = pVVar2;
  return;
}

Assistant:

static inline void Vec_MemHashAlloc( Vec_Mem_t * p, int nTableSize )
{
    assert( p->vTable == NULL && p->vNexts == NULL );
    p->vTable = Vec_IntStartFull( Abc_PrimeCudd(nTableSize) );
    p->vNexts = Vec_IntAlloc( nTableSize );
}